

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall
cmCTestRunTest::ForkProcess
          (cmCTestRunTest *this,double testTimeOut,bool explicitTimeout,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *environment)

{
  cmCTest *this_00;
  bool bVar1;
  cmProcess *this_01;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  char *local_1b8 [4];
  SaveRestoreEnvironment sre;
  
  this_01 = (cmProcess *)operator_new(0xc0);
  cmProcess::cmProcess(this_01);
  this->TestProcess = this_01;
  this_01->Id = this->Index;
  std::__cxx11::string::assign((char *)&this_01->WorkingDirectory);
  cmProcess::SetCommand(this->TestProcess,(this->ActualCommand)._M_dataplus._M_p);
  cmProcess::SetCommandArguments(this->TestProcess,&this->Arguments);
  dVar3 = cmCTest::GetRemainingTimeAllowed(this->CTest);
  dVar3 = dVar3 + -120.0;
  dVar7 = this->CTest->TimeOut;
  dVar4 = dVar7;
  if (dVar3 <= dVar7) {
    dVar4 = dVar3;
  }
  dVar7 = (double)(~-(ulong)(0.0 < dVar7) & (ulong)dVar3 | (ulong)dVar4 & -(ulong)(0.0 < dVar7));
  if (0.0 < testTimeOut) {
    dVar4 = cmCTest::GetRemainingTimeAllowed(this->CTest);
    if (testTimeOut < dVar4) {
      dVar7 = testTimeOut;
    }
  }
  uVar6 = ~-(ulong)(0.0 < dVar7) & 0x3ff0000000000000 | (ulong)dVar7 & -(ulong)(0.0 < dVar7);
  uVar5 = 0;
  if (!explicitTimeout) {
    uVar5 = uVar6;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&sre);
  poVar2 = (ostream *)std::ostream::operator<<((ostringstream *)&sre,this->Index);
  poVar2 = std::operator<<(poVar2,": ");
  std::operator<<(poVar2,"Test timeout computed to be: ");
  dVar7 = (double)(-(ulong)(testTimeOut == 0.0) & uVar5 | ~-(ulong)(testTimeOut == 0.0) & uVar6);
  poVar2 = std::ostream::_M_insert<double>(dVar7);
  std::operator<<(poVar2,"\n");
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x2be,local_1b8[0],(this->TestHandler->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sre);
  this->TestProcess->Timeout = dVar7;
  cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(&sre);
  if ((environment !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) &&
     ((environment->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (environment->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    cmSystemTools::AppendEnv(environment);
  }
  bVar1 = cmProcess::StartProcess(this->TestProcess);
  cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(&sre);
  return bVar1;
}

Assistant:

bool cmCTestRunTest::ForkProcess(double testTimeOut, bool explicitTimeout,
                                 std::vector<std::string>* environment)
{
  this->TestProcess = new cmProcess;
  this->TestProcess->SetId(this->Index);
  this->TestProcess->SetWorkingDirectory(
    this->TestProperties->Directory.c_str());
  this->TestProcess->SetCommand(this->ActualCommand.c_str());
  this->TestProcess->SetCommandArguments(this->Arguments);

  // determine how much time we have
  double timeout = this->CTest->GetRemainingTimeAllowed() - 120;
  if (this->CTest->GetTimeOut() > 0 && this->CTest->GetTimeOut() < timeout) {
    timeout = this->CTest->GetTimeOut();
  }
  if (testTimeOut > 0 &&
      testTimeOut < this->CTest->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }
  // always have at least 1 second if we got to here
  if (timeout <= 0) {
    timeout = 1;
  }
  // handle timeout explicitly set to 0
  if (testTimeOut == 0 && explicitTimeout) {
    timeout = 0;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index
                       << ": "
                       << "Test timeout computed to be: " << timeout << "\n",
                     this->TestHandler->GetQuiet());

  this->TestProcess->SetTimeout(timeout);

#ifdef CMAKE_BUILD_WITH_CMAKE
  cmSystemTools::SaveRestoreEnvironment sre;
#endif

  if (environment && !environment->empty()) {
    cmSystemTools::AppendEnv(*environment);
  }

  return this->TestProcess->StartProcess();
}